

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Sphere::Sphere(Sphere *this,SphereInfo *info,Vector3D *position,double scale)

{
  double dVar1;
  BSDF *pBVar2;
  
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00280788;
  this->r = (double)info->radius * scale;
  dVar1 = position->y;
  (this->p).x = position->x;
  (this->p).y = dVar1;
  (this->p).z = position->z;
  if (info->material == (MaterialInfo *)0x0) {
    pBVar2 = (BSDF *)operator_new(0x28);
    pBVar2->_vptr_BSDF = (_func_int **)&PTR_f_00280f58;
    pBVar2[1]._vptr_BSDF = (_func_int **)0x3f0000003f000000;
    *(undefined ***)&pBVar2[1].rasterize_color = &PTR__Sampler3D_00281190;
    (pBVar2->rasterize_color).r = 0.5;
    (pBVar2->rasterize_color).g = 0.5;
    *(undefined8 *)&(pBVar2->rasterize_color).b = 0x3f0000003f000000;
  }
  else {
    pBVar2 = info->material->bsdf;
  }
  this->bsdf = pBVar2;
  return;
}

Assistant:

Sphere::Sphere(const Collada::SphereInfo& info, const Vector3D& position,
               const double scale)
    : p(position), r(info.radius * scale) {
  if (info.material) {
    bsdf = info.material->bsdf;
  } else {
    bsdf = new DiffuseBSDF(Spectrum(0.5f, 0.5f, 0.5f));
  }
}